

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStringEncode
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,
          StringEncode *curr)

{
  Name breakTo;
  Literals *a;
  bool bVar1;
  Literal *pLVar2;
  element_type *peVar3;
  size_t sVar4;
  ulong uVar5;
  Literal *this_00;
  Literal local_178;
  uint local_15c;
  ulong uStack_158;
  Index i;
  size_t end;
  Literals *arrayValues;
  Literals *strValues;
  uint64_t startVal;
  shared_ptr<wasm::GCData> arrayData;
  shared_ptr<wasm::GCData> strData;
  Flow start;
  Flow array;
  undefined1 local_78 [8];
  Flow str;
  StringEncode *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  if (curr->op == StringEncodeWTF16Array) {
    visit((Flow *)local_78,this,curr->str);
    bVar1 = Flow::breaking((Flow *)local_78);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_78);
    }
    else {
      visit((Flow *)&start.breakTo.super_IString.str._M_str,this,curr->array);
      bVar1 = Flow::breaking((Flow *)&start.breakTo.super_IString.str._M_str);
      if (bVar1) {
        Flow::Flow(__return_storage_ptr__,(Flow *)&start.breakTo.super_IString.str._M_str);
      }
      else {
        visit((Flow *)&strData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,this,curr->start);
        bVar1 = Flow::breaking((Flow *)&strData.
                                        super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
        if (bVar1) {
          Flow::Flow(__return_storage_ptr__,
                     (Flow *)&strData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
        }
        else {
          Flow::getSingleValue((Flow *)local_78);
          wasm::Literal::getGCData
                    ((Literal *)
                     &arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          Flow::getSingleValue((Flow *)&start.breakTo.super_IString.str._M_str);
          wasm::Literal::getGCData((Literal *)&startVal);
          bVar1 = std::__shared_ptr::operator_cast_to_bool
                            ((__shared_ptr *)
                             &arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
          if ((!bVar1) ||
             (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&startVal), !bVar1))
          {
            (*this->_vptr_ExpressionRunner[2])(this,"null ref");
          }
          pLVar2 = Flow::getSingleValue
                             ((Flow *)&strData.
                                       super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount);
          strValues = (Literals *)wasm::Literal::getUnsigned(pLVar2);
          peVar3 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&arrayData.
                                    super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
          arrayValues = &peVar3->values;
          peVar3 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&startVal);
          a = strValues;
          end = (size_t)&peVar3->values;
          sVar4 = SmallVector<wasm::Literal,_1UL>::size
                            (&arrayValues->super_SmallVector<wasm::Literal,_1UL>);
          bVar1 = std::ckd_add<unsigned_long>(&stack0xfffffffffffffea8,(unsigned_long)a,sVar4);
          if ((bVar1) ||
             (sVar4 = SmallVector<wasm::Literal,_1UL>::size((SmallVector<wasm::Literal,_1UL> *)end),
             sVar4 < uStack_158)) {
            (*this->_vptr_ExpressionRunner[2])(this,"oob");
          }
          for (local_15c = 0; uVar5 = (ulong)local_15c,
              sVar4 = SmallVector<wasm::Literal,_1UL>::size
                                (&arrayValues->super_SmallVector<wasm::Literal,_1UL>), uVar5 < sVar4
              ; local_15c = local_15c + 1) {
            pLVar2 = SmallVector<wasm::Literal,_1UL>::operator[]
                               (&arrayValues->super_SmallVector<wasm::Literal,_1UL>,(ulong)local_15c
                               );
            this_00 = SmallVector<wasm::Literal,_1UL>::operator[]
                                ((SmallVector<wasm::Literal,_1UL> *)end,
                                 (long)(strValues->super_SmallVector<wasm::Literal,_1UL>).fixed.
                                       _M_elems + ((ulong)local_15c - 8));
            wasm::Literal::operator=(this_00,pLVar2);
          }
          peVar3 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&arrayData.
                                    super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
          sVar4 = SmallVector<wasm::Literal,_1UL>::size
                            (&(peVar3->values).super_SmallVector<wasm::Literal,_1UL>);
          wasm::Literal::Literal(&local_178,(int32_t)sVar4);
          Flow::Flow(__return_storage_ptr__,&local_178);
          wasm::Literal::~Literal(&local_178);
          std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)&startVal);
          std::shared_ptr<wasm::GCData>::~shared_ptr
                    ((shared_ptr<wasm::GCData> *)
                     &arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        Flow::~Flow((Flow *)&strData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
      }
      Flow::~Flow((Flow *)&start.breakTo.super_IString.str._M_str);
    }
    Flow::~Flow((Flow *)local_78);
  }
  else {
    str.breakTo.super_IString.str._M_str = NONCONSTANT_FLOW;
    breakTo.super_IString.str._M_str = DAT_03194068;
    breakTo.super_IString.str._M_len = (size_t)NONCONSTANT_FLOW;
    Flow::Flow(__return_storage_ptr__,breakTo);
  }
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringEncode(StringEncode* curr) {
    // For now we only support JS-style strings into arrays.
    if (curr->op != StringEncodeWTF16Array) {
      return Flow(NONCONSTANT_FLOW);
    }

    Flow str = visit(curr->str);
    if (str.breaking()) {
      return str;
    }
    Flow array = visit(curr->array);
    if (array.breaking()) {
      return array;
    }
    Flow start = visit(curr->start);
    if (start.breaking()) {
      return start;
    }

    auto strData = str.getSingleValue().getGCData();
    auto arrayData = array.getSingleValue().getGCData();
    if (!strData || !arrayData) {
      trap("null ref");
    }
    auto startVal = start.getSingleValue().getUnsigned();
    auto& strValues = strData->values;
    auto& arrayValues = arrayData->values;
    size_t end;
    if (std::ckd_add<size_t>(&end, startVal, strValues.size()) ||
        end > arrayValues.size()) {
      trap("oob");
    }

    for (Index i = 0; i < strValues.size(); i++) {
      arrayValues[startVal + i] = strValues[i];
    }

    return Literal(int32_t(strData->values.size()));
  }